

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_moves(m68k_info *info,int size)

{
  byte bVar1;
  uint uVar2;
  float fVar3;
  ulong uVar4;
  
  MCInst_setOpcode(info->inst,0x11f);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  uVar2 = info->pc;
  uVar4 = (ulong)(uVar2 - (int)info->baseAddress & info->address_mask);
  if (info->code_len < uVar4 + 2) {
    info->pc = uVar2 + 2;
    fVar3 = 1.54143e-44;
  }
  else {
    bVar1 = info->code[uVar4];
    info->pc = uVar2 + 2;
    if ((bVar1 & 8) == 0) {
      get_ea_mode_op(info,(info->extension).operands,info->ir,size);
      (info->extension).operands[1].field_0.reg =
           (bVar1 >> 4 & 7) + (uint)(bVar1 >> 7) * 8 + M68K_REG_D0;
      return;
    }
    fVar3 = (float)((bVar1 >> 4 & 7) + (uint)(bVar1 >> 7) * 8 + 1);
  }
  (info->extension).operands[0].field_0.simm = fVar3;
  get_ea_mode_op(info,(info->extension).operands + 1,info->ir,size);
  return;
}

Assistant:

static void build_moves(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVES, 2, size);
	uint extension = read_imm_16(info);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	if (BIT_B(extension)) {
		op0->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
		get_ea_mode_op(info, op1, info->ir, size);
	} else {
		get_ea_mode_op(info, op0, info->ir, size);
		op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
	}
}